

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_mergable.cpp
# Opt level: O0

void __thiscall
cpp_client::Delta_mergable::Delta_mergable
          (Delta_mergable *this,
          initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
          init)

{
  unordered_map<std::__cxx11::string,cpp_client::Any,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>>
  *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
  *puVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>
  local_68;
  const_iterator local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>
  *obj;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
  *__range1;
  Delta_mergable *this_local;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
  init_local;
  
  init_local._M_array = (iterator)init._M_len;
  this_local = (Delta_mergable *)init._M_array;
  this->_vptr_Delta_mergable = (_func_int **)&PTR___cxa_pure_virtual_0019c4a0;
  __range1 = (initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
              *)this;
  puVar1 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
            *)operator_new(0x38);
  memset(puVar1,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
  ::unordered_map(puVar1);
  std::
  unique_ptr<cpp_client::Delta_mergable_delay_variables,std::default_delete<cpp_client::Delta_mergable_delay_variables>>
  ::unique_ptr<std::default_delete<cpp_client::Delta_mergable_delay_variables>,void>
            ((unique_ptr<cpp_client::Delta_mergable_delay_variables,std::default_delete<cpp_client::Delta_mergable_delay_variables>>
              *)&this->variable_storage_,(pointer)puVar1);
  puVar1 = &std::
            unique_ptr<cpp_client::Delta_mergable_delay_variables,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
            ::operator->(&this->variable_storage_)->variables_;
  this->variables_ = puVar1;
  __begin1 = (const_iterator)&this_local;
  __end1 = std::
           initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
           ::begin((initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
                    *)__begin1);
  obj = std::
        initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
        ::end((initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
               *)__begin1);
  for (; __end1 != obj; __end1 = __end1 + 1) {
    local_40 = __end1;
    this_00 = (unordered_map<std::__cxx11::string,cpp_client::Any,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>>
               *)this->variables_;
    std::make_pair<std::__cxx11::string_const,cpp_client::Any>
              (&local_68,&__end1->first,__end1->second);
    std::
    unordered_map<std::__cxx11::string,cpp_client::Any,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>>
    ::emplace<std::pair<std::__cxx11::string,cpp_client::Any>>(this_00,&local_68);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>
    ::~pair(&local_68);
  }
  return;
}

Assistant:

Delta_mergable::Delta_mergable(std::initializer_list<std::pair<std::string, Any&&>> init) :
   variable_storage_(new Delta_mergable_delay_variables{}),
   variables_(variable_storage_->variables_)
{
   for(auto&& obj : init)
   {
      variables_.emplace(std::make_pair(std::move(obj.first), std::move(obj.second)));
   }
}